

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O0

string * cfd::api::json::
         ExecuteDirectApi<cfd::api::json::DecodePsbtRequest,cfd::api::json::DecodePsbtResponse>
                   (string *request_message,
                   function<void_(cfd::api::json::DecodePsbtRequest_*,_cfd::api::json::DecodePsbtResponse_*)>
                   *function)

{
  function<void_(cfd::api::json::DecodePsbtRequest_*,_cfd::api::json::DecodePsbtResponse_*)> *in_RDX
  ;
  string *in_RDI;
  DecodePsbtResponse response;
  CfdException *cfd_except;
  CfdException ex;
  DecodePsbtRequest req;
  DecodePsbtResponse *in_stack_fffffffffffffd10;
  DecodePsbtRequest *in_stack_fffffffffffffd18;
  DecodePsbtRequest *in_stack_fffffffffffffd50;
  DecodePsbtResponse *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd78;
  JsonClassBase<cfd::api::json::DecodePsbtRequest> *in_stack_fffffffffffffd80;
  JsonClassBase<cfd::api::json::DecodePsbtResponse> *in_stack_fffffffffffffe68;
  
  DecodePsbtRequest::DecodePsbtRequest(in_stack_fffffffffffffd50);
  core::JsonClassBase<cfd::api::json::DecodePsbtRequest>::Deserialize
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  DecodePsbtResponse::DecodePsbtResponse(in_stack_fffffffffffffd60);
  std::function<void_(cfd::api::json::DecodePsbtRequest_*,_cfd::api::json::DecodePsbtResponse_*)>::
  operator()(in_RDX,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  core::JsonClassBase<cfd::api::json::DecodePsbtResponse>::Serialize_abi_cxx11_
            (in_stack_fffffffffffffe68);
  DecodePsbtResponse::~DecodePsbtResponse(in_stack_fffffffffffffd10);
  DecodePsbtRequest::~DecodePsbtRequest((DecodePsbtRequest *)in_stack_fffffffffffffd10);
  return in_RDI;
}

Assistant:

std::string ExecuteDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    throw cfd_except;
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    throw ex;
  }

  ResponseType response;
  function(&req, &response);
  return response.Serialize();
}